

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::readObject(Reader *this,Token *tokenStart)

{
  iterator *piVar1;
  ValueHolder *pVVar2;
  TokenType TVar3;
  bool bVar4;
  int iVar5;
  _Elt_pointer ppVVar6;
  byte unaff_BPL;
  Value numberName;
  string name;
  Token colon;
  Token comma;
  Token tokenName;
  ValueHolder local_f0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  string local_c8;
  string local_a8;
  Token local_88;
  Token local_70;
  Value local_58;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  Value::Value(&local_58,objectValue);
  ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar6 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::operator=(ppVVar6[-1],&local_58);
  Value::~Value(&local_58);
  ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar6 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::setOffsetStart(ppVVar6[-1],(long)tokenStart->start_ - (long)this->begin_);
  do {
    readToken(this,&local_70);
    while (TVar3 = local_70.type_, local_70.type_ == tokenComment) {
      readToken(this,&local_70);
    }
    if ((local_70.type_ == tokenObjectEnd) && ((char *)local_c8._M_string_length == (char *)0x0)) {
LAB_00594a6b:
      unaff_BPL = 1;
      iVar5 = 1;
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)&local_c8,0,(char *)local_c8._M_string_length,0x5f2b3e);
      iVar5 = 3;
      if (TVar3 == tokenNumber) {
        if ((this->features_).allowNumericKeys_ == true) {
          Value::Value((Value *)local_f0,nullValue);
          bVar4 = decodeNumber(this,&local_70,(Value *)local_f0);
          if (bVar4) {
            Value::asString_abi_cxx11_(&local_a8,(Value *)local_f0);
            std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
                &local_a8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                       (int)local_a8._M_dataplus._M_p),
                              local_a8.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            recoverFromError(this,tokenObjectEnd);
            unaff_BPL = 0;
          }
          Value::~Value((Value *)local_f0);
          iVar5 = 1;
          if (bVar4) goto LAB_00594937;
        }
      }
      else if (TVar3 == tokenString) {
        bVar4 = decodeString(this,&local_70,&local_c8);
        if (bVar4) {
LAB_00594937:
          readToken(this,(Token *)&local_a8);
          if ((int)local_a8._M_dataplus._M_p == 0xb) {
            ppVVar6 = (this->nodes_).c.
                      super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur;
            if (ppVVar6 ==
                (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVVar6 = (this->nodes_).c.
                        super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            local_f0[0].map_ = (ObjectValues *)Value::operator[](ppVVar6[-1],&local_c8);
            pVVar2 = (ValueHolder *)
                     (this->nodes_).c.
                     super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
            if (pVVar2 == (ValueHolder *)
                          ((this->nodes_).c.
                           super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_last + -1)) {
              std::deque<Json::Value*,std::allocator<Json::Value*>>::_M_push_back_aux<Json::Value*>
                        ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,
                         (Value **)&local_f0[0].map_);
            }
            else {
              pVVar2->map_ = (ObjectValues *)local_f0[0];
              piVar1 = &(this->nodes_).c.
                        super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                        super__Deque_impl_data._M_finish;
              piVar1->_M_cur = piVar1->_M_cur + 1;
            }
            bVar4 = readValue(this);
            std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
                      ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
            if (!bVar4) {
              recoverFromError(this,tokenObjectEnd);
              goto LAB_00594a5d;
            }
            readToken(this,&local_88);
            if ((local_88.type_ < tokenError) && ((0x1404U >> (local_88.type_ & 0x1f) & 1) != 0)) {
              while (local_88.type_ == tokenComment) {
                readToken(this,&local_88);
              }
              if (local_88.type_ == tokenObjectEnd) goto LAB_00594a6b;
              iVar5 = 0;
              goto LAB_00594a73;
            }
            local_f0[0].string_ = (char *)&local_e0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f0,"Missing \',\' or \'}\' in object declaration","");
            addError(this,(string *)local_f0,&local_88,(Location)0x0);
            recoverFromError(this,tokenObjectEnd);
          }
          else {
            local_f0[0].string_ = (char *)&local_e0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f0,"Missing \':\' after object member name","");
            addError(this,(string *)local_f0,(Token *)&local_a8,(Location)0x0);
            recoverFromError(this,tokenObjectEnd);
          }
          if (local_f0[0] != &local_e0) {
            operator_delete(local_f0[0].string_,local_e0._M_allocated_capacity + 1);
          }
        }
        else {
          recoverFromError(this,tokenObjectEnd);
        }
LAB_00594a5d:
        iVar5 = 1;
        unaff_BPL = 0;
      }
    }
LAB_00594a73:
    if (iVar5 != 0) {
      if (iVar5 == 3) {
        local_f0[0].string_ = (char *)&local_e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f0,"Missing \'}\' or object member name","");
        addError(this,(string *)local_f0,&local_70,(Location)0x0);
        recoverFromError(this,tokenObjectEnd);
        if (local_f0[0] != &local_e0) {
          operator_delete(local_f0[0].string_,local_e0._M_allocated_capacity + 1);
        }
        unaff_BPL = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                 local_c8.field_2._M_local_buf[0]) + 1);
      }
      return (bool)(unaff_BPL & 1);
    }
  } while( true );
}

Assistant:

bool Reader::readObject(Token& tokenStart) {
  Token tokenName;
  std::string name;
  currentValue() = Value(objectValue);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd && name.empty()) // empty object
      return true;
    name = "";
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover(
          "Missing ':' after object member name", colon, tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover(
          "Missing ',' or '}' in object declaration", comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover(
      "Missing '}' or object member name", tokenName, tokenObjectEnd);
}